

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevkeyboardhandler.cpp
# Opt level: O0

unique_ptr<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>_>
QEvdevKeyboardHandler::create(QString *device,QString *specification,QString *defaultKeymapFile)

{
  QLatin1StringView s;
  QLatin1StringView s_00;
  QLatin1StringView s_01;
  QLatin1StringView s_02;
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *ok;
  pointer __p;
  undefined8 uVar4;
  QString *in_RDX;
  QString *in_RSI;
  QEvdevKeyboardHandler *in_RDI;
  long in_FS_OFFSET;
  QStringView *arg;
  QList<QStringView> *__range1;
  int grab;
  bool enableCompose;
  bool disableZap;
  int repeatRate;
  int repeatDelay;
  QFdContainer fd;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QStringView> args;
  QString keymapFile;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  int kbdrep [2];
  QLoggingCategory *in_stack_fffffffffffffd78;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_fffffffffffffd80;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_fffffffffffffd88;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_fffffffffffffd90;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_fffffffffffffd98;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_fffffffffffffda0;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *pos;
  _Head_base<0UL,_QEvdevKeyboardHandler_*,_false> _Var5;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  QLatin1StringView in_stack_fffffffffffffdd0;
  uint local_1e0;
  int local_1d8;
  int local_1d4;
  char local_198 [60];
  QFdContainer local_15c;
  char local_158 [32];
  QStringView local_138;
  QStringView local_128;
  QStringView local_118;
  QLatin1StringView local_108;
  QLatin1StringView local_f8;
  QStringView local_e8;
  QStringView *local_c0;
  const_iterator local_b8;
  const_iterator local_b0;
  QChar local_a2;
  undefined1 local_a0 [16];
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  char local_60 [32];
  undefined8 local_40;
  ulong local_38;
  undefined8 local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  undefined8 local_20;
  undefined1 local_18;
  undefined7 uStack_17;
  int local_10;
  int iStack_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaa;
  uStack_17 = 0xaaaaaaaaaaaaaa;
  _Var5._M_head_impl = in_RDI;
  QtPrivateLogging::qLcEvdevKey();
  anon_unknown.dwarf_16dddd::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_20), bVar1) {
    anon_unknown.dwarf_16dddd::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x143f6f);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88,
               (int)((ulong)in_stack_fffffffffffffd80 >> 0x20),(char *)in_stack_fffffffffffffd78,
               (char *)0x143f88);
    QtPrivate::asString(in_RSI);
    uVar4 = QString::utf16();
    QtPrivate::asString(in_RDX);
    uVar3 = QString::utf16();
    QMessageLogger::debug(local_60,"Try to create keyboard handler for \"%ls\" \"%ls\"",uVar4,uVar3)
    ;
    local_18 = 0;
  }
  local_78 = 0xaaaaaaaaaaaaaaaa;
  local_70 = 0xaaaaaaaaaaaaaaaa;
  local_68 = 0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)in_stack_fffffffffffffd80,(QString *)in_stack_fffffffffffffd78);
  local_1d4 = 400;
  local_1d8 = 0x50;
  local_1e0 = 0;
  local_90 = 0xaaaaaaaaaaaaaaaa;
  local_88 = 0xaaaaaaaaaaaaaaaa;
  local_80 = 0xaaaaaaaaaaaaaaaa;
  QStringView::QStringView<QString,_true>
            ((QStringView *)in_stack_fffffffffffffd90,(QString *)in_stack_fffffffffffffd88);
  QChar::QChar<char16_t,_true>(&local_a2,L':');
  QFlags<Qt::SplitBehaviorFlags>::QFlags
            ((QFlags<Qt::SplitBehaviorFlags> *)in_stack_fffffffffffffd80,
             (SplitBehaviorFlags)((ulong)in_stack_fffffffffffffd78 >> 0x20));
  QStringView::split((QChar)(char16_t)&local_90,(QFlags_conflict *)local_a0,
                     (uint)(ushort)local_a2.ucs);
  local_b0.i = (QStringView *)0xaaaaaaaaaaaaaaaa;
  local_b0 = QList<QStringView>::begin((QList<QStringView> *)in_stack_fffffffffffffd80);
  local_b8.i = (QStringView *)0xaaaaaaaaaaaaaaaa;
  local_b8 = QList<QStringView>::end((QList<QStringView> *)in_stack_fffffffffffffd80);
  while( true ) {
    local_c0 = local_b8.i;
    bVar1 = QList<QStringView>::const_iterator::operator!=(&local_b0,local_b8);
    if (!bVar1) break;
    ok = (QLoggingCategoryMacroHolder<(QtMsgType)0> *)
         QList<QStringView>::const_iterator::operator*(&local_b0);
    pos = ok;
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80);
    s.m_data = (char *)pos;
    s.m_size = (qsizetype)in_stack_fffffffffffffda0;
    bVar1 = QStringView::startsWith((QStringView *)in_stack_fffffffffffffd78,s,CaseInsensitive);
    if (bVar1) {
      local_e8 = QStringView::mid((QStringView *)in_stack_fffffffffffffd98,(qsizetype)pos,
                                  (qsizetype)in_stack_fffffffffffffda0);
      QStringView::toString((QStringView *)in_stack_fffffffffffffd80);
      QString::operator=((QString *)in_stack_fffffffffffffd80,(QString *)in_stack_fffffffffffffd78);
      QString::~QString((QString *)0x144257);
    }
    else {
      in_stack_fffffffffffffda0 = ok;
      local_f8 = Qt::Literals::StringLiterals::operator____L1
                           ((char *)in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80);
      bVar1 = ::operator==((QStringView *)in_stack_fffffffffffffd80,
                           (QLatin1StringView *)in_stack_fffffffffffffd78);
      if (!bVar1) {
        in_stack_fffffffffffffd98 = ok;
        local_108 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80);
        bVar1 = ::operator==((QStringView *)in_stack_fffffffffffffd80,
                             (QLatin1StringView *)in_stack_fffffffffffffd78);
        if (!bVar1) {
          in_stack_fffffffffffffd90 = ok;
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80);
          s_00.m_data = (char *)pos;
          s_00.m_size = (qsizetype)in_stack_fffffffffffffda0;
          bVar1 = QStringView::startsWith
                            ((QStringView *)in_stack_fffffffffffffd78,s_00,CaseInsensitive);
          if (bVar1) {
            local_118 = QStringView::mid((QStringView *)in_stack_fffffffffffffd98,(qsizetype)pos,
                                         (qsizetype)in_stack_fffffffffffffda0);
            local_1d4 = QStringView::toInt((QStringView *)in_stack_fffffffffffffd88,
                                           (bool *)in_stack_fffffffffffffd80,
                                           (int)((ulong)in_stack_fffffffffffffd78 >> 0x20));
          }
          else {
            in_stack_fffffffffffffd88 = ok;
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)ok,(size_t)in_stack_fffffffffffffd80);
            s_01.m_data = (char *)pos;
            s_01.m_size = (qsizetype)in_stack_fffffffffffffda0;
            bVar1 = QStringView::startsWith
                              ((QStringView *)in_stack_fffffffffffffd78,s_01,CaseInsensitive);
            if (bVar1) {
              local_128 = QStringView::mid((QStringView *)in_stack_fffffffffffffd98,(qsizetype)pos,
                                           (qsizetype)in_stack_fffffffffffffda0);
              local_1d8 = QStringView::toInt((QStringView *)in_stack_fffffffffffffd88,
                                             (bool *)in_stack_fffffffffffffd80,
                                             (int)((ulong)in_stack_fffffffffffffd78 >> 0x20));
            }
            else {
              in_stack_fffffffffffffdd0 =
                   Qt::Literals::StringLiterals::operator____L1
                             ((char *)in_stack_fffffffffffffd88,(size_t)ok);
              s_02.m_data = (char *)pos;
              s_02.m_size = (qsizetype)in_stack_fffffffffffffda0;
              bVar1 = QStringView::startsWith
                                ((QStringView *)in_stack_fffffffffffffd78,s_02,CaseInsensitive);
              in_stack_fffffffffffffd80 = ok;
              if (bVar1) {
                local_138 = QStringView::mid((QStringView *)in_stack_fffffffffffffd98,(qsizetype)pos
                                             ,(qsizetype)in_stack_fffffffffffffda0);
                local_1e0 = QStringView::toInt((QStringView *)in_stack_fffffffffffffd88,(bool *)ok,
                                               (int)((ulong)in_stack_fffffffffffffd78 >> 0x20));
                in_stack_fffffffffffffd80 = ok;
              }
            }
          }
        }
      }
    }
    QList<QStringView>::const_iterator::operator++(&local_b0);
  }
  local_30 = 0xaaaaaaaaaaaaaaaa;
  local_28 = 0xaa;
  uStack_27 = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::qLcEvdevKey();
  anon_unknown.dwarf_16dddd::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_30), bVar1) {
    anon_unknown.dwarf_16dddd::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x14452a);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88,
               (int)((ulong)in_stack_fffffffffffffd80 >> 0x20),(char *)in_stack_fffffffffffffd78,
               (char *)0x144543);
    QtPrivate::asString(in_RSI);
    uVar4 = QString::utf16();
    QMessageLogger::debug(local_158,"Opening keyboard at %ls",uVar4);
    local_28 = 0;
  }
  local_15c.m_fd = -0x55555556;
  QString::toLocal8Bit((QString *)in_stack_fffffffffffffd98);
  QByteArray::constData((QByteArray *)0x1445aa);
  iVar2 = qt_safe_open((char *)in_stack_fffffffffffffd80,
                       (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),
                       (mode_t)in_stack_fffffffffffffd78);
  QFdContainer::QFdContainer(&local_15c,iVar2);
  QByteArray::~QByteArray((QByteArray *)0x1445d5);
  iVar2 = QFdContainer::get(&local_15c);
  if (iVar2 < 0) {
    local_40 = 0xaaaaaaaaaaaaaaaa;
    local_38 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::qLcEvdevKey();
    anon_unknown.dwarf_16dddd::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_40), bVar1) {
      anon_unknown.dwarf_16dddd::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x14463e);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88,
                 (int)((ulong)in_stack_fffffffffffffd80 >> 0x20),(char *)in_stack_fffffffffffffd78,
                 (char *)0x144657);
      QMessageLogger::debug
                (local_198,"Keyboard device could not be opened as read-write, trying read-only");
      local_38 = local_38 & 0xffffffffffffff00;
    }
    QString::toLocal8Bit((QString *)in_stack_fffffffffffffd98);
    QByteArray::constData((QByteArray *)0x144699);
    qt_safe_open((char *)in_stack_fffffffffffffd80,(int)((ulong)in_stack_fffffffffffffd78 >> 0x20),
                 (mode_t)in_stack_fffffffffffffd78);
    QFdContainer::reset((QFdContainer *)in_stack_fffffffffffffd80,
                        (int)((ulong)in_stack_fffffffffffffd78 >> 0x20));
    QByteArray::~QByteArray((QByteArray *)0x1446c4);
  }
  iVar2 = QFdContainer::get(&local_15c);
  if (iVar2 < 0) {
    QtPrivate::asString(in_RSI);
    uVar4 = QString::utf16();
    qErrnoWarning("Cannot open keyboard input device \'%ls\'",uVar4);
    std::unique_ptr<QEvdevKeyboardHandler,std::default_delete<QEvdevKeyboardHandler>>::
    unique_ptr<std::default_delete<QEvdevKeyboardHandler>,void>
              ((unique_ptr<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>_> *)
               in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  }
  else {
    iVar2 = QFdContainer::get(&local_15c);
    ioctl(iVar2,0x40044590,(ulong)local_1e0);
    if ((0 < local_1d4) && (0 < local_1d8)) {
      _local_10 = CONCAT44(local_1d8,local_1d4);
      iVar2 = QFdContainer::get(&local_15c);
      ioctl(iVar2,0x40084503,&local_10);
    }
    __p = (pointer)operator_new(0x68);
    QEvdevKeyboardHandler
              ((QEvdevKeyboardHandler *)in_stack_fffffffffffffdd0.m_data,
               (QString *)in_stack_fffffffffffffdd0.m_size,
               (QFdContainer *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
               SUB81((ulong)_Var5._M_head_impl >> 0x38,0),SUB81((ulong)_Var5._M_head_impl >> 0x30,0)
               ,(QString *)in_RDI);
    std::unique_ptr<QEvdevKeyboardHandler,std::default_delete<QEvdevKeyboardHandler>>::
    unique_ptr<std::default_delete<QEvdevKeyboardHandler>,void>
              ((unique_ptr<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>_> *)
               in_stack_fffffffffffffd80,__p);
  }
  QFdContainer::~QFdContainer((QFdContainer *)0x144807);
  QList<QStringView>::~QList((QList<QStringView> *)0x144814);
  QString::~QString((QString *)0x144821);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (__uniq_ptr_data<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>,_true,_true>
          )(tuple<QEvdevKeyboardHandler_*,_std::default_delete<QEvdevKeyboardHandler>_>)
           _Var5._M_head_impl;
}

Assistant:

std::unique_ptr<QEvdevKeyboardHandler> QEvdevKeyboardHandler::create(const QString &device,
                                                     const QString &specification,
                                                     const QString &defaultKeymapFile)
{
    qCDebug(qLcEvdevKey, "Try to create keyboard handler for \"%ls\" \"%ls\"",
            qUtf16Printable(device), qUtf16Printable(specification));

    QString keymapFile = defaultKeymapFile;
    int repeatDelay = 400;
    int repeatRate = 80;
    bool disableZap = false;
    bool enableCompose = false;
    int grab = 0;

    const auto args = QStringView{specification}.split(u':');
    for (const auto &arg : args) {
        if (arg.startsWith("keymap="_L1))
            keymapFile = arg.mid(7).toString();
        else if (arg == "disable-zap"_L1)
            disableZap = true;
        else if (arg == "enable-compose"_L1)
            enableCompose = true;
        else if (arg.startsWith("repeat-delay="_L1))
            repeatDelay = arg.mid(13).toInt();
        else if (arg.startsWith("repeat-rate="_L1))
            repeatRate = arg.mid(12).toInt();
        else if (arg.startsWith("grab="_L1))
            grab = arg.mid(5).toInt();
    }

    qCDebug(qLcEvdevKey, "Opening keyboard at %ls", qUtf16Printable(device));

    QFdContainer fd(qt_safe_open(device.toLocal8Bit().constData(), O_RDWR | O_NDELAY, 0));
    if (fd.get() < 0) {
        qCDebug(qLcEvdevKey, "Keyboard device could not be opened as read-write, trying read-only");
        fd.reset(qt_safe_open(device.toLocal8Bit().constData(), O_RDONLY | O_NDELAY, 0));
    }
    if (fd.get() >= 0) {
        ::ioctl(fd.get(), EVIOCGRAB, grab);
        if (repeatDelay > 0 && repeatRate > 0) {
            int kbdrep[2] = { repeatDelay, repeatRate };
            ::ioctl(fd.get(), EVIOCSREP, kbdrep);
        }

        return std::unique_ptr<QEvdevKeyboardHandler>(new QEvdevKeyboardHandler(device, fd, disableZap, enableCompose, keymapFile));
    } else {
        qErrnoWarning("Cannot open keyboard input device '%ls'", qUtf16Printable(device));
        return nullptr;
    }
}